

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy.h
# Opt level: O1

Contents __thiscall
snmalloc::
Buddy<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_4UL,_14UL>
::add_block(Buddy<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_4UL,_14UL>
            *this,Contents addr,size_t size)

{
  size_t sVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  *this_00;
  undefined8 uStack_828;
  RBPath local_820;
  
  while (bVar2 = remove_buddy(this,addr,size), bVar2) {
    sVar1 = size * 2;
    addr.unsafe_capptr = addr.unsafe_capptr & size * -2;
    size = sVar1;
    if (sVar1 == 0x4000) {
      return (Contents)addr.unsafe_capptr;
    }
  }
  uVar4 = 0x3f;
  if (size - 1 != 0) {
    for (; size - 1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  lVar5 = -4;
  if (size != 1) {
    lVar5 = (uVar4 ^ 0xffffffffffffffc0) + 0x3d;
  }
  uVar4 = lVar5 + 1U;
  if (lVar5 + 1U < this->empty_at_or_above) {
    uVar4 = this->empty_at_or_above;
  }
  this->empty_at_or_above = uVar4;
  lVar3 = 0;
  do {
    if (*(long *)((long)&(this->entries)._M_elems[lVar5].cache[0].unsafe_capptr + lVar3) == 0) {
      *(FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
        **)((long)&(this->entries)._M_elems[lVar5].cache[0].unsafe_capptr + lVar3) =
           addr.unsafe_capptr;
      return (Contents)
             (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)0x0;
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  lVar3 = 8;
  do {
    *(undefined8 *)((long)&uStack_828 + lVar3) = 0;
    *(undefined1 *)((long)&local_820.path._M_elems[0].node.ptr.val + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x808);
  this_00 = &(this->entries)._M_elems[lVar5].tree;
  local_820.path._M_elems[0].dir = false;
  local_820.length = 1;
  local_820.path._M_elems[0].node.ptr.val = (H)(H)this_00;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  ::find(this_00,&local_820,(K)addr.unsafe_capptr);
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  ::insert_path(this_00,&local_820,(K)addr.unsafe_capptr);
  return (Contents)
         (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          *)0x0;
}

Assistant:

typename Rep::Contents add_block(typename Rep::Contents addr, size_t size)
    {
      validate_block(addr, size);

      if (remove_buddy(addr, size))
      {
        // Add to next level cache
        size *= 2;
        addr = Rep::align_down(addr, size);
        if (size == bits::one_at_bit(MAX_SIZE_BITS))
        {
          // Invariant should be checked on all non-tail return paths.
          // Holds trivially here with current design.
          invariant();
          // Too big for this buddy allocator.
          return addr;
        }
        return add_block(addr, size);
      }

      auto idx = to_index(size);
      empty_at_or_above = bits::max(empty_at_or_above, idx + 1);

      for (auto& e : entries[idx].cache)
      {
        if (Rep::equal(Rep::null, e))
        {
          e = addr;
          return Rep::null;
        }
      }

      auto path = entries[idx].tree.get_root_path();
      entries[idx].tree.find(path, addr);
      entries[idx].tree.insert_path(path, addr);
      invariant();
      return Rep::null;
    }